

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformDisjunction(Impl *this,AtomSpan *atoms)

{
  uint *puVar1;
  size_t sVar2;
  Atom_t *pAVar3;
  uint32 uVar4;
  ulong uVar5;
  uint32 uVar6;
  long lVar7;
  Atom_t *pAVar8;
  size_type sVar9;
  LitSpan local_48;
  AtomSpan *local_38;
  
  sVar9 = (this->lits_).ebo_.size;
  puVar1 = atoms->first;
  sVar2 = atoms->size;
  local_38 = atoms;
  for (lVar7 = 4; sVar2 << 2 != lVar7; lVar7 = lVar7 + 4) {
    local_48.first = (int *)CONCAT44(local_48.first._4_4_,-*(int *)((long)puVar1 + lVar7));
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_48);
  }
  pAVar3 = local_38->first;
  sVar2 = local_38->size;
  uVar6 = 0;
  pAVar8 = pAVar3;
  while( true ) {
    local_48.size = (size_t)(this->lits_).ebo_.size;
    local_48.first = (int *)local_48.size;
    if ((pointer)local_48.size != (pointer)0x0) {
      local_48.first = (this->lits_).ebo_.buf;
    }
    uVar4 = addRule(this,*pAVar8,&local_48);
    uVar6 = uVar6 + uVar4;
    if (pAVar8 + 1 == pAVar3 + sVar2) break;
    uVar5 = (ulong)sVar9;
    sVar9 = sVar9 + 1;
    (this->lits_).ebo_.buf[uVar5] = -*pAVar8;
    pAVar8 = pAVar8 + 1;
  }
  return uVar6;
}

Assistant:

uint32 RuleTransform::Impl::transformDisjunction(const Potassco::AtomSpan& atoms) {
	uint32 bIdx = sizeVec(lits_);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms) + 1, end = Potassco::end(atoms); it != end; ++it) {
		lits_.push_back(Potassco::neg(*it));
	}
	uint32 nRule = 0;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms);;) {
		nRule += addRule(*it, Potassco::toSpan(lits_));
		if (++it == end) { break; }
		lits_[bIdx++] = Potassco::neg(*(it-1));
	}
	return nRule;
}